

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stubs.h
# Opt level: O2

_Bool fdready(int fd)

{
  int iVar1;
  _Bool _Var2;
  pollfd local_18;
  pollfd pfd;
  
  local_18.events = 0x40;
  local_18.revents = 0;
  local_18.fd = fd;
  _Var2 = false;
  iVar1 = poll(&local_18,1,0);
  if (iVar1 != 0) {
    if (iVar1 == 1) {
      _Var2 = true;
    }
    else {
      _Var2 = false;
      conveyError("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/tests/stubs.h",
                  0x4c,"BAD POLL RETURN!");
    }
  }
  return _Var2;
}

Assistant:

bool
fdready(int fd)
{
	struct pollfd pfd;
	pfd.fd      = (PLATFD) fd;
	pfd.events  = POLLRDNORM;
	pfd.revents = 0;

	switch (poll(&pfd, 1, 0)) {
	case 0:
		return (false);
	case 1:
		return (true);
	default:
#ifdef CONVEY_H
		ConveyError("BAD POLL RETURN!");
#elif defined(TEST_CHECK)
		TEST_ASSERT(0);
#endif
		return (false);
	}
}